

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_utf_validate(nk_rune *u,int i)

{
  int i_local;
  nk_rune *u_local;
  int local_4;
  
  if (u == (nk_rune *)0x0) {
    local_4 = 0;
  }
  else {
    if (((*u < nk_utfmin[i]) || (nk_utfmax[i] < *u)) || ((0xd7ff < *u && (*u < 0xe000)))) {
      *u = 0xfffd;
    }
    for (i_local = 1; nk_utfmax[i_local] < *u; i_local = i_local + 1) {
    }
    local_4 = i_local;
  }
  return local_4;
}

Assistant:

NK_INTERN int
nk_utf_validate(nk_rune *u, int i)
{
    NK_ASSERT(u);
    if (!u) return 0;
    if (!NK_BETWEEN(*u, nk_utfmin[i], nk_utfmax[i]) ||
         NK_BETWEEN(*u, 0xD800, 0xDFFF))
            *u = NK_UTF_INVALID;
    for (i = 1; *u > nk_utfmax[i]; ++i);
    return i;
}